

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::polygon_layer_to_gds(three_dim_model *this,int *layer_number)

{
  int layer;
  bool bVar1;
  mapped_type *pmVar2;
  pointer corX;
  pointer pcVar3;
  vector<int,_std::allocator<int>_> *in_RCX;
  void *__buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  gdsSTR local_388;
  co_ord *local_290;
  gdsBOUNDARY local_288;
  key_type_conflict local_21c;
  __normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_218;
  iterator poly_it;
  __normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_208;
  iterator poly_end;
  undefined1 local_1d0 [8];
  gdsSTR main;
  gdscpp my_polygons;
  int *layer_number_local;
  three_dim_model *this_local;
  
  gdscpp::gdscpp((gdscpp *)
                 &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  gdsSTR::gdsSTR((gdsSTR *)local_1d0);
  std::__cxx11::to_string((string *)&poly_end,*layer_number);
  std::__cxx11::string::operator=((string *)local_1d0,(string *)&poly_end);
  std::__cxx11::string::~string((string *)&poly_end);
  poly_it._M_current._4_4_ = *layer_number;
  pmVar2 = std::
           map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
           ::operator[](&this->polygons_map,(key_type_conflict *)((long)&poly_it._M_current + 4));
  local_208._M_current = (co_ord *)std::vector<co_ord,_std::allocator<co_ord>_>::end(pmVar2);
  local_21c = *layer_number;
  pmVar2 = std::
           map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
           ::operator[](&this->polygons_map,&local_21c);
  local_218._M_current = (co_ord *)std::vector<co_ord,_std::allocator<co_ord>_>::begin(pmVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_218,&local_208);
    if (!bVar1) break;
    layer = *layer_number;
    corX = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
           operator->(&local_218);
    pcVar3 = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
             operator->(&local_218);
    in_RCX = &pcVar3->y;
    drawBoundary(&local_288,layer,&corX->x,in_RCX);
    std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::push_back
              ((vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> *)
               &main.last_modified.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_288);
    gdsBOUNDARY::~gdsBOUNDARY(&local_288);
    local_290 = (co_ord *)
                __gnu_cxx::
                __normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
                operator++(&local_218,0);
  }
  gdsSTR::gdsSTR(&local_388,(gdsSTR *)local_1d0);
  gdscpp::setSTR((gdscpp *)
                 &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_388);
  gdsSTR::~gdsSTR(&local_388);
  std::operator+(&local_3c8,"data/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  std::operator+(&local_3a8,&local_3c8,".gds");
  gdscpp::write((gdscpp *)
                &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(int)&local_3a8,__buf,(size_t)in_RCX);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  gdsSTR::~gdsSTR((gdsSTR *)local_1d0);
  gdscpp::~gdscpp((gdscpp *)
                  &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void MODEL3D::three_dim_model::polygon_layer_to_gds(const int &layer_number)
{
    gdscpp my_polygons;
    gdsSTR main;
    main.name = std::to_string(layer_number);
    auto poly_end = polygons_map[layer_number].end();
    for (auto poly_it = polygons_map[layer_number].begin(); poly_it != poly_end; poly_it++)
    {
        main.BOUNDARY.push_back(drawBoundary( layer_number , poly_it->x, poly_it->y));
    }
    my_polygons.setSTR(main);
    my_polygons.write("data/"+main.name+".gds");
}